

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

string * util::text_word_wrap(string *__return_storage_ptr__,string *string,int width)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (string->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + string->_M_string_length);
  if (__return_storage_ptr__->_M_string_length != 0) {
    iVar3 = 0;
    uVar5 = 0;
    do {
      uVar4 = (ulong)(byte)(__return_storage_ptr__->_M_dataplus)._M_p[uVar5];
      iVar2 = 0;
      if ((uVar4 != 0x20) &&
         (iVar2 = iVar3 + *(int *)(sizes + uVar4 * 4), width < iVar3 + *(int *)(sizes + uVar4 * 4)))
      {
        std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar5 - 1,(char *)0x0,0x1a4506);
        iVar2 = 0;
      }
      iVar3 = iVar2;
      uVar5 = uVar5 + 1;
    } while (uVar5 < __return_storage_ptr__->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string text_word_wrap(const std::string& string, int width)
{
	int length = 0;
	std::string result(string);

	for (std::size_t i = 0; i < result.length(); ++i)
	{
		if (result[i] == ' ')
		{
			length = 0;
		}
		else
		{
			length += sizes[result[i] & 0xFF];

			if (length > width)
			{
				result.insert(i - 1, " ");
				length = 0;
			}
		}
	}

	return result;
}